

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Boost::set(V2Boost *this,syVBoost *para)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float ia0;
  float cAp1;
  float cAm1;
  float Ap1;
  float Am1;
  float bs;
  float beta;
  float A;
  syVBoost *para_local;
  V2Boost *this_local;
  
  this->enabled = (int)para->amount != 0;
  if ((this->enabled & 1U) != 0) {
    fVar1 = powf(2.0,para->amount / 128.0);
    fVar2 = sqrtf(fVar1 * 2.0);
    fVar2 = fVar2 * this->inst->SRfcBoostSin;
    fVar3 = fVar1 - 1.0;
    fVar4 = fVar1 + 1.0;
    fVar5 = fVar3 * this->inst->SRfcBoostCos;
    fVar6 = fVar4 * this->inst->SRfcBoostCos;
    fVar7 = 1.0 / (fVar4 + fVar5 + fVar2);
    this->b1 = fVar1 * 2.0 * (fVar3 - fVar6) * fVar7;
    this->a1 = (fVar3 + fVar6) * -2.0 * fVar7;
    this->a2 = ((fVar4 + fVar5) - fVar2) * fVar7;
    this->b0 = fVar1 * ((fVar4 - fVar5) + fVar2) * fVar7;
    this->b2 = fVar1 * ((fVar4 - fVar5) - fVar2) * fVar7;
  }
  return;
}

Assistant:

void set(const syVBoost *para)
    {
        enabled = ((int)para->amount) != 0;
        if (!enabled)
            return;

        COVER("BOOST set");

        // A = 10^(dBgain/40), or a rough approximation anyway
        float A = powf(2.0f, para->amount / 128.0f);

        // V2 code computes beta = sqrt((A^2 + 1) - (A-1)^2) for some reason
        // but applying the binomial formula just gives sqrt(2A)
        float beta = sqrtf(2.0f * A);

        // temp vars
        float bs = beta * inst->SRfcBoostSin;
        float Am1 = A - 1.0f;
        float Ap1 = A + 1.0f;
        float cAm1 = Am1 * inst->SRfcBoostCos;
        float cAp1 = Ap1 * inst->SRfcBoostCos;

        // a0 = (A+1) + (A-1)*cos + beta*sin
        float ia0 = 1.0f / (Ap1 + cAm1 + bs);

        b1 = 2.0f * A * (Am1 - cAp1) * ia0;
        a1 = -2.0f * (Am1 + cAp1) * ia0;
        a2 = (Ap1 + cAm1 - bs) * ia0;
        b0 = A * (Ap1 - cAm1 + bs) * ia0;
        b2 = A * (Ap1 - cAm1 - bs) * ia0;
    }